

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_cloud_decoder.cc
# Opt level: O2

bool __thiscall draco::PointCloudDecoder::DecodeAllAttributes(PointCloudDecoder *this)

{
  pointer puVar1;
  AttributesDecoderInterface *pAVar2;
  pointer puVar3;
  int iVar4;
  pointer puVar5;
  unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>
  *att_dec;
  
  puVar1 = (this->attributes_decoders_).
           super__Vector_base<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>,_std::allocator<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  puVar3 = (this->attributes_decoders_).
           super__Vector_base<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>,_std::allocator<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  do {
    puVar5 = puVar3;
    if (puVar5 == puVar1) break;
    pAVar2 = (puVar5->_M_t).
             super___uniq_ptr_impl<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>
             ._M_t.
             super__Tuple_impl<0UL,_draco::AttributesDecoderInterface_*,_std::default_delete<draco::AttributesDecoderInterface>_>
             .super__Head_base<0UL,_draco::AttributesDecoderInterface_*,_false>._M_head_impl;
    iVar4 = (*pAVar2->_vptr_AttributesDecoderInterface[4])(pAVar2,this->buffer_);
    puVar3 = puVar5 + 1;
  } while ((char)iVar4 != '\0');
  return puVar5 == puVar1;
}

Assistant:

bool PointCloudDecoder::DecodeAllAttributes() {
  for (auto &att_dec : attributes_decoders_) {
    if (!att_dec->DecodeAttributes(buffer_)) {
      return false;
    }
  }
  return true;
}